

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

void InverseMoveToFrontTransform(uint8_t *v,uint32_t v_len,BrotliDecoderStateInternal *state)

{
  byte bVar1;
  uint8_t uVar2;
  uint uVar3;
  uint32_t *puVar4;
  uint local_44;
  uint32_t uStack_40;
  uint8_t value;
  int index;
  uint32_t pattern;
  uint8_t b0123 [4];
  uint8_t *mtf_u8;
  uint32_t *mtf;
  uint32_t upper_bound;
  uint32_t i;
  BrotliDecoderStateInternal *state_local;
  uint32_t v_len_local;
  uint8_t *v_local;
  
  mtf._4_4_ = 1;
  uVar3 = state->mtf_upper_bound;
  puVar4 = state->mtf + 1;
  uStack_40 = 0x3020100;
  *puVar4 = 0x3020100;
  do {
    uStack_40 = uStack_40 + 0x4040404;
    puVar4[mtf._4_4_] = uStack_40;
    mtf._4_4_ = mtf._4_4_ + 1;
  } while (mtf._4_4_ <= uVar3);
  mtf._0_4_ = 0;
  for (mtf._4_4_ = 0; mtf._4_4_ < v_len; mtf._4_4_ = mtf._4_4_ + 1) {
    bVar1 = v[mtf._4_4_];
    uVar2 = *(uint8_t *)((long)puVar4 + (long)(int)(uint)bVar1);
    mtf._0_4_ = v[mtf._4_4_] | (uint)mtf;
    v[mtf._4_4_] = uVar2;
    *(uint8_t *)((long)state->mtf + 3) = uVar2;
    local_44 = (uint)bVar1;
    do {
      uVar3 = local_44 - 1;
      *(undefined1 *)((long)puVar4 + (long)(int)local_44) =
           *(undefined1 *)((long)puVar4 + (long)(int)uVar3);
      local_44 = uVar3;
    } while (-1 < (int)uVar3);
  }
  state->mtf_upper_bound = (uint)mtf >> 2;
  return;
}

Assistant:

static BROTLI_NOINLINE void InverseMoveToFrontTransform(
    uint8_t* v, uint32_t v_len, BrotliDecoderState* state) {
  /* Reinitialize elements that could have been changed. */
  uint32_t i = 1;
  uint32_t upper_bound = state->mtf_upper_bound;
  uint32_t* mtf = &state->mtf[1];  /* Make mtf[-1] addressable. */
  uint8_t* mtf_u8 = (uint8_t*)mtf;
  /* Load endian-aware constant. */
  const uint8_t b0123[4] = {0, 1, 2, 3};
  uint32_t pattern;
  memcpy(&pattern, &b0123, 4);

  /* Initialize list using 4 consequent values pattern. */
  mtf[0] = pattern;
  do {
    pattern += 0x04040404;  /* Advance all 4 values by 4. */
    mtf[i] = pattern;
    i++;
  } while (i <= upper_bound);

  /* Transform the input. */
  upper_bound = 0;
  for (i = 0; i < v_len; ++i) {
    int index = v[i];
    uint8_t value = mtf_u8[index];
    upper_bound |= v[i];
    v[i] = value;
    mtf_u8[-1] = value;
    do {
      index--;
      mtf_u8[index + 1] = mtf_u8[index];
    } while (index >= 0);
  }
  /* Remember amount of elements to be reinitialized. */
  state->mtf_upper_bound = upper_bound >> 2;
}